

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_qe_de_dispatch.c
# Opt level: O0

parasail_result_t *
parasail_sg_qe_de_stats_table_diag_32_dispatcher
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  parasail_result_t *ppVar2;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  
  iVar1 = parasail_can_use_avx2();
  if (iVar1 == 0) {
    iVar1 = parasail_can_use_sse41();
    if (iVar1 == 0) {
      iVar1 = parasail_can_use_sse2();
      if (iVar1 == 0) {
        parasail_sg_qe_de_stats_table_diag_32_pointer = parasail_sg_qe_de;
      }
      else {
        parasail_sg_qe_de_stats_table_diag_32_pointer =
             parasail_sg_qe_de_stats_table_diag_sse2_128_32;
      }
    }
    else {
      parasail_sg_qe_de_stats_table_diag_32_pointer =
           parasail_sg_qe_de_stats_table_diag_sse41_128_32;
    }
  }
  else {
    parasail_sg_qe_de_stats_table_diag_32_pointer = parasail_sg_qe_de_stats_table_diag_avx2_256_32;
  }
  ppVar2 = (*parasail_sg_qe_de_stats_table_diag_32_pointer)(s1,s1Len,s2,s2Len,open,gap,matrix);
  return ppVar2;
}

Assistant:

parasail_result_t* parasail_sg_qe_de_stats_table_diag_32_dispatcher(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        const parasail_matrix_t *matrix)
{
#if HAVE_AVX2
    if (parasail_can_use_avx2()) {
        parasail_sg_qe_de_stats_table_diag_32_pointer = parasail_sg_qe_de_stats_table_diag_avx2_256_32;
    }
    else
#endif
#if HAVE_SSE41
    if (parasail_can_use_sse41()) {
        parasail_sg_qe_de_stats_table_diag_32_pointer = parasail_sg_qe_de_stats_table_diag_sse41_128_32;
    }
    else
#endif
#if HAVE_SSE2
    if (parasail_can_use_sse2()) {
        parasail_sg_qe_de_stats_table_diag_32_pointer = parasail_sg_qe_de_stats_table_diag_sse2_128_32;
    }
    else
#endif
#if HAVE_ALTIVEC
    if (parasail_can_use_altivec()) {
        parasail_sg_qe_de_stats_table_diag_32_pointer = parasail_sg_qe_de_stats_table_diag_altivec_128_32;
    }
    else
#endif
#if HAVE_NEON
    if (parasail_can_use_neon()) {
        parasail_sg_qe_de_stats_table_diag_32_pointer = parasail_sg_qe_de_stats_table_diag_neon_128_32;
    }
    else
#endif
    {
        parasail_sg_qe_de_stats_table_diag_32_pointer = parasail_sg_qe_de;
    }
    return parasail_sg_qe_de_stats_table_diag_32_pointer(s1, s1Len, s2, s2Len, open, gap, matrix);
}